

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O1

char * mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>::GetTypeName
                 (void)

{
  int iVar1;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long *local_38 [2];
  long local_28 [2];
  
  if (CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<-1>>>::GetTypeName()::
      nm_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<-1>>>
                                 ::GetTypeName()::nm_abi_cxx11_);
    if (iVar1 != 0) {
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Conditional< ","");
      plVar2 = (long *)std::__cxx11::string::append((char *)local_38);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_58.field_2._M_allocated_capacity = *psVar3;
        local_58.field_2._8_8_ = plVar2[3];
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      }
      else {
        local_58.field_2._M_allocated_capacity = *psVar3;
        local_58._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_58._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::operator+(&CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<-1>>>::
                      GetTypeName()::nm_abi_cxx11_,&local_58," >");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
      __cxa_atexit(std::__cxx11::string::~string,
                   &CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<-1>>>::
                    GetTypeName()::nm_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<-1>>>
                           ::GetTypeName()::nm_abi_cxx11_);
    }
  }
  return CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<-1>>>::GetTypeName()::
         nm_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

static const char* GetTypeName() {
    static std::string nm =
      std::string("Conditional< ") +
      typeid(Con).name() + " >";
    return nm.c_str();
  }